

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_benchmark.cpp
# Opt level: O0

void __thiscall tst_benchmark::valueFinally(tst_benchmark *this)

{
  Logs *pLVar1;
  ulong uVar2;
  QString local_b8;
  QPromiseBase<Data> local_a0;
  QPromiseBase<Data> local_90;
  QPromiseBase<Data> local_80;
  int local_6c;
  int *piStack_68;
  int value_1;
  undefined1 local_4c [20];
  QPromiseBase<Data> local_38;
  QPromiseBase<Data> local_28;
  int local_14;
  tst_benchmark *ptStack_10;
  int value;
  tst_benchmark *this_local;
  
  local_14 = -1;
  ptStack_10 = this;
  pLVar1 = Logger::logs();
  Logs::reset(pLVar1);
  Data::Data((Data *)local_4c,0x2a);
  QtPromise::QPromise<Data>::resolve((QPromise<Data> *)(local_4c + 4),(Data_conflict *)local_4c);
  piStack_68 = &local_14;
  QtPromise::QPromiseBase<Data>::finally<tst_benchmark::valueFinally()::__0>
            (&local_38,(anon_class_8_1_a8c68091)(local_4c + 4));
  QtPromise::QPromiseBase<Data>::wait(&local_28,&local_38);
  QtPromise::QPromise<Data>::~QPromise((QPromise<Data> *)&local_28);
  QtPromise::QPromise<Data>::~QPromise((QPromise<Data> *)&local_38);
  QtPromise::QPromise<Data>::~QPromise((QPromise<Data> *)(local_4c + 4));
  Data::~Data((Data *)local_4c);
  pLVar1 = Logger::logs();
  uVar2 = QTest::qCompare(pLVar1->ctor,1,"Data::logs().ctor","1",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
                          ,0xc9);
  if ((uVar2 & 1) != 0) {
    pLVar1 = Logger::logs();
    uVar2 = QTest::qCompare(pLVar1->copy,0,"Data::logs().copy","0",
                            "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
                            ,0xca);
    if ((uVar2 & 1) != 0) {
      pLVar1 = Logger::logs();
      uVar2 = QTest::qCompare(pLVar1->move,1,"Data::logs().move","1",
                              "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
                              ,0xcb);
      if ((uVar2 & 1) != 0) {
        pLVar1 = Logger::logs();
        uVar2 = QTest::qCompare(pLVar1->refs,0,"Data::logs().refs","0",
                                "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
                                ,0xcc);
        if (((uVar2 & 1) != 0) &&
           (uVar2 = QTest::qCompare(local_14,0x2a,"value","42",
                                    "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
                                    ,0xcd), (uVar2 & 1) != 0)) {
          local_6c = -1;
          pLVar1 = Logger::logs();
          Logs::reset(pLVar1);
          QString::QString(&local_b8,"foo");
          QtPromise::QPromiseBase<Data>::reject<QString>(&local_a0,&local_b8);
          QtPromise::QPromiseBase<Data>::finally<tst_benchmark::valueFinally()::__1>
                    (&local_90,(anon_class_8_1_a8c68091)&local_a0);
          QtPromise::QPromiseBase<Data>::wait(&local_80,&local_90);
          QtPromise::QPromise<Data>::~QPromise((QPromise<Data> *)&local_80);
          QtPromise::QPromise<Data>::~QPromise((QPromise<Data> *)&local_90);
          QtPromise::QPromise<Data>::~QPromise((QPromise<Data> *)&local_a0);
          QString::~QString(&local_b8);
          pLVar1 = Logger::logs();
          uVar2 = QTest::qCompare(pLVar1->ctor,0,"Data::logs().ctor","0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
                                  ,0xd8);
          if ((uVar2 & 1) != 0) {
            pLVar1 = Logger::logs();
            uVar2 = QTest::qCompare(pLVar1->copy,0,"Data::logs().copy","0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
                                    ,0xd9);
            if ((uVar2 & 1) != 0) {
              pLVar1 = Logger::logs();
              uVar2 = QTest::qCompare(pLVar1->move,0,"Data::logs().move","0",
                                      "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
                                      ,0xda);
              if ((uVar2 & 1) != 0) {
                pLVar1 = Logger::logs();
                uVar2 = QTest::qCompare(pLVar1->refs,0,"Data::logs().refs","0",
                                        "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
                                        ,0xdb);
                if ((uVar2 & 1) != 0) {
                  QTest::qCompare(local_6c,0x2a,"value","42",
                                  "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
                                  ,0xdc);
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void tst_benchmark::valueFinally()
{
    { // should not copy the value on continuation if fulfilled
        int value = -1;
        Data::logs().reset();
        QtPromise::QPromise<Data>::resolve(Data{42})
            .finally([&]() {
                value = 42;
            })
            .wait();

        QCOMPARE(Data::logs().ctor, 1);
        QCOMPARE(Data::logs().copy, 0);
        QCOMPARE(Data::logs().move, 1); // move value to the input and output promise data
        QCOMPARE(Data::logs().refs, 0);
        QCOMPARE(value, 42);
    }
    { // should not create value on continuation if rejected
        int value = -1;
        Data::logs().reset();
        QtPromise::QPromise<Data>::reject(QString{"foo"})
            .finally([&]() {
                value = 42;
            })
            .wait();

        QCOMPARE(Data::logs().ctor, 0);
        QCOMPARE(Data::logs().copy, 0);
        QCOMPARE(Data::logs().move, 0);
        QCOMPARE(Data::logs().refs, 0);
        QCOMPARE(value, 42);
    }
}